

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_short,unsigned_long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  i;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_01;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  bits;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  bits_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_02;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_03;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_04;
  unsigned_long_long u2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  st2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  su;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st
  ;
  bool b;
  unsigned_short t;
  unsigned_long_long u;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde6;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffde8;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  undefined4 in_stack_fffffffffffffdf0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe02;
  undefined2 in_stack_fffffffffffffe04;
  undefined2 in_stack_fffffffffffffe06;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe08;
  unsigned_short local_1a;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_e;
  byte local_b;
  unsigned_short local_a;
  unsigned_long_long local_8;
  
  local_8 = 0;
  local_a = 0;
  local_b = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long_long>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             &in_stack_fffffffffffffdd8->m_int);
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt(&local_18,&local_8);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long_long>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                         CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int);
  local_b = (local_b ^ 0xff) & 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (unsigned_short *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (unsigned_long_long *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                        CONCAT24(in_stack_fffffffffffffde4.m_int,
                                 CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
            in_stack_fffffffffffffdd8);
  local_e.m_int = local_1a;
  SafeInt::operator_cast_to_unsigned_long_long
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator*((unsigned_long_long)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  SVar1.m_int._2_2_ = in_stack_fffffffffffffde2;
  SVar1.m_int._0_2_ = in_stack_fffffffffffffde0;
  SVar1.m_int._4_2_ = in_stack_fffffffffffffde4.m_int;
  SVar1.m_int._6_2_ = in_stack_fffffffffffffde6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdd8,SVar1);
  local_8 = 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
  ::operator=((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                          CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
              (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  rhs.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs);
  local_8 = 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator/(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  i.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  i.m_int._0_4_ = in_stack_fffffffffffffdf0;
  i.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,i);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator+((unsigned_long_long)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  rhs_00.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_00.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_00);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  local_8 = 0;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator-((unsigned_long_long)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                        CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
            (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
  ::operator=((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                          CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
              (int *)in_stack_fffffffffffffde8.m_int);
  rhs_01.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_01.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_01);
  local_8 = 1;
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
  ::operator=((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffdf6.m_int,
                          CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
              (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe06,
                         CONCAT24(in_stack_fffffffffffffe04,
                                  CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffe08);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator<<(in_stack_fffffffffffffdf6.m_int,in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                          CONCAT24(in_stack_fffffffffffffde4.m_int,
                                   CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
              (unsigned_long_long)in_stack_fffffffffffffdd8);
  bits.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  bits.m_int._0_4_ = in_stack_fffffffffffffdf0;
  bits.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffde8.m_int,bits);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffe06,
                         CONCAT24(in_stack_fffffffffffffe04,
                                  CONCAT22(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffe08);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator>>(in_stack_fffffffffffffdf6.m_int,in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                          CONCAT24(in_stack_fffffffffffffde4.m_int,
                                   CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
              (unsigned_long_long)in_stack_fffffffffffffdd8);
  bits_00.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  bits_00.m_int._0_4_ = in_stack_fffffffffffffdf0;
  bits_00.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffde8.m_int,bits_00);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator&(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  rhs_02.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_02.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_02.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_02);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator|(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  rhs_03.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_03.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_03.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_03);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffde8.m_int,
            CONCAT26(in_stack_fffffffffffffde6.m_int,
                     CONCAT24(in_stack_fffffffffffffde4.m_int,
                              CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator^(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                         CONCAT24(in_stack_fffffffffffffde4.m_int,
                                  CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (unsigned_long_long)in_stack_fffffffffffffdd8);
  rhs_04.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_04.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_04.m_int._6_2_ = in_stack_fffffffffffffdf6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffde8.m_int,rhs_04);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8.m_int);
  local_b = operator<((unsigned_long_long)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde6);
  local_b = operator<(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator<=(in_stack_fffffffffffffde6,(unsigned_long_long)in_stack_fffffffffffffdd8);
  local_b = operator<=(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  local_b = operator<=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>(in_stack_fffffffffffffde6,(unsigned_long_long)in_stack_fffffffffffffdd8);
  local_b = operator>(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf6);
  local_b = operator>(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8.m_int);
  local_b = operator>=((unsigned_long_long)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde6);
  local_b = operator>=(in_stack_fffffffffffffdf6,in_stack_fffffffffffffde8);
  SVar1.m_int = local_18.m_int;
  lhs.m_int = local_e.m_int;
  local_b = operator==(local_e,local_18);
  local_b = operator==(local_e,(unsigned_long_long)in_stack_fffffffffffffdd8);
  local_b = operator==((unsigned_long_long)in_stack_fffffffffffffdd8,local_e);
  operator==(lhs,SVar1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}